

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootchart.c
# Opt level: O1

int bootchart_step(void)

{
  uint len;
  int iVar1;
  DIR *__dirp;
  dirent *pdVar2;
  ulong uVar3;
  size_t sVar4;
  char *__s;
  char *__s_00;
  char *end;
  char filename [32];
  char buff [1024];
  char *local_860;
  char local_858 [32];
  char local_838 [1024];
  char local_438 [1032];
  
  do_log_file(log_stat,"/proc/stat");
  do_log_file(log_disks,"/proc/diskstats");
  __dirp = opendir("/proc");
  do_log_uptime(log_procs);
  pdVar2 = readdir(__dirp);
  if (pdVar2 != (dirent *)0x0) {
    do {
      uVar3 = strtol(pdVar2->d_name,&local_860,10);
      if ((pdVar2->d_name < local_860) && (*local_860 == '\0')) {
        snprintf(local_858,0x20,"/proc/%d/cmdline",uVar3 & 0xffffffff);
        proc_read(local_858,local_438,0x400);
        snprintf(local_858,0x20,"/proc/%d/stat",uVar3 & 0xffffffff);
        iVar1 = open(local_858,0);
        if (-1 < iVar1) {
          len = unix_read(iVar1,local_838,0x3ff);
          close(iVar1);
          if (0 < (int)len) {
            sVar4 = strlen(local_438);
            if ((int)sVar4 < 1) {
              __s_00 = local_838;
            }
            else {
              local_838[len] = '\0';
              __s = strchr(local_838,0x28);
              __s_00 = strchr(__s,0x29);
              file_buff_write(log_procs,local_838,((int)__s - (int)local_838) + 1);
              file_buff_write(log_procs,local_438,(int)sVar4);
              sVar4 = strlen(__s_00);
              len = (uint)sVar4;
            }
            file_buff_write(log_procs,__s_00,len);
          }
        }
      }
      pdVar2 = readdir(__dirp);
    } while (pdVar2 != (dirent *)0x0);
  }
  closedir(__dirp);
  file_buff_write(log_procs,"\n",1);
  iVar1 = proc_read("/var/log/bootchart-stop",local_838,2);
  return -(uint)(local_838[0] == '1' && 0 < iVar1);
}

Assistant:

int  bootchart_step( void )
{
    do_log_file(log_stat,   "/proc/stat");
    do_log_file(log_disks,  "/proc/diskstats");
    do_log_procs(log_procs);

    /* we stop when /data/bootchart-stop contains 1 */
    {
        char  buff[2];
        if (proc_read(LOG_STOPFILE,buff,sizeof(buff)) > 0 && buff[0] == '1') {
            return -1;
        }
    }

    return 0;
}